

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::addRawStackInfo(SimpleLoggerMgr *this,bool crash_origin)

{
  pointer pRVar1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  value_type *__x;
  long lVar5;
  bool bVar6;
  id tid;
  void *stack_ptr [256];
  hash<std::thread::id> local_859;
  RawStackInfo local_858;
  value_type local_828 [256];
  
  __x = local_828;
  iVar2 = backtrace(__x,0x100);
  local_858._0_8_ = (ulong)(uint)local_858._4_4_ << 0x20;
  local_858.kernelTid = 0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_858.crashOrigin = false;
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  emplace_back<SimpleLoggerMgr::RawStackInfo>(&this->crashDumpThreadStacks,&local_858);
  lVar5 = (long)iVar2;
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&local_858.stackPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  pRVar1 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_858._0_8_ = pthread_self();
  sVar3 = std::hash<std::thread::id>::operator()(&local_859,(id *)&local_858);
  pRVar1[-1].tidHash = (uint)sVar3 & 0xffff;
  uVar4 = syscall(0xba);
  pRVar1[-1].kernelTid = uVar4;
  pRVar1[-1].crashOrigin = crash_origin;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&pRVar1[-1].stackPtrs,__x);
    __x = __x + 1;
  }
  return;
}

Assistant:

void SimpleLoggerMgr::addRawStackInfo(bool crash_origin) {
#if defined(__linux__) || defined(__APPLE__)
    void* stack_ptr[256];
    size_t len = _stack_backtrace(stack_ptr, 256);

    crashDumpThreadStacks.push_back(RawStackInfo());
    RawStackInfo& stack_info = *(crashDumpThreadStacks.rbegin());
    std::thread::id tid = std::this_thread::get_id();
    stack_info.tidHash = std::hash<std::thread::id>{}(tid) % 0x10000;
#ifdef __linux__
    stack_info.kernelTid = (uint64_t)syscall(SYS_gettid);
#endif
    stack_info.crashOrigin = crash_origin;
    for (size_t ii=0; ii<len; ++ii) {
        stack_info.stackPtrs.push_back(stack_ptr[ii]);
    }
#endif
}